

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O3

bool __thiscall r_exec::CSTOverlay::reduce(CSTOverlay *this,View *input,CSTOverlay **offspring)

{
  atomic_int_fast64_t *paVar1;
  pointer pPVar2;
  pointer pcVar3;
  _Object *p_Var4;
  HLPBindingMap *pHVar5;
  Atom *pAVar6;
  bool simulation;
  bool bVar7;
  int iVar8;
  Pred *this_00;
  _Object *p_Var9;
  HLPBindingMap *this_01;
  CSTOverlay *pCVar10;
  pointer pPVar11;
  long lVar12;
  int64_t iVar13;
  
  iVar8 = (*((input->super_View).object.object)->_vptr__Object[0xe])();
  if ((char)iVar8 == '\0') {
    pPVar2 = (this->inputs).
             super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar11 = (this->inputs).
                   super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar2;
        pPVar11 = pPVar11 + 1) {
      p_Var9 = pPVar11->object;
      if (p_Var9 == (_Object *)0x0) {
        if ((input->super_View).object.object == (_Object *)0x0) goto LAB_0016195b;
      }
      else {
        LOCK();
        (p_Var9->refCount).super___atomic_base<long>._M_i =
             (p_Var9->refCount).super___atomic_base<long>._M_i + 1;
        UNLOCK();
        if ((input->super_View).object.object == p_Var9) {
          *offspring = (CSTOverlay *)0x0;
          LOCK();
          (p_Var9->refCount).super___atomic_base<long>._M_i =
               (p_Var9->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if ((p_Var9->refCount).super___atomic_base<long>._M_i < 1) {
            (*p_Var9->_vptr__Object[1])();
          }
          goto LAB_00161962;
        }
        LOCK();
        (p_Var9->refCount).super___atomic_base<long>._M_i =
             (p_Var9->refCount).super___atomic_base<long>._M_i + -1;
        UNLOCK();
        if ((p_Var9->refCount).super___atomic_base<long>._M_i < 1) {
          (*p_Var9->_vptr__Object[1])();
        }
      }
    }
    this_00 = _Fact::get_pred((_Fact *)(input->super_View).object.object);
    if (this_00 == (Pred *)0x0) {
      p_Var9 = (input->super_View).object.object;
      simulation = false;
    }
    else {
      p_Var9 = (_Object *)Pred::get_target(this_00);
      simulation = Pred::is_simulation(this_00);
    }
    this_01 = (HLPBindingMap *)operator_new(0x40);
    HLPBindingMap::HLPBindingMap(this_01);
    LOCK();
    paVar1 = &(this_01->super_BindingMap).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    for (iVar13 = (this->super_HLPOverlay).patterns.used_cells_head; iVar13 != -1;
        iVar13 = pcVar3[iVar13].next) {
      HLPBindingMap::load(this_01,(HLPBindingMap *)(this->super_HLPOverlay).bindings.object);
      if ((this->inputs).
          super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          (this->inputs).
          super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        BindingMap::reset_fwd_timings((BindingMap *)this_01,(_Fact *)p_Var9);
      }
      bVar7 = BindingMap::match_fwd_strict
                        ((BindingMap *)this_01,(_Fact *)p_Var9,
                         (_Fact *)(this->super_HLPOverlay).patterns.cells.
                                  super__Vector_base<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar13].data.object);
      pcVar3 = (this->super_HLPOverlay).patterns.cells.
               super__Vector_base<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (bVar7) {
        p_Var9 = pcVar3[iVar13].data.object;
        if (p_Var9 != (_Object *)0x0) {
          if ((this->super_HLPOverlay).patterns.used_cell_count == 1) {
            if ((this->super_HLPOverlay).super_Overlay.code != (Atom *)0x0) {
              update(this,this_01,(_Fact *)(input->super_View).object.object,(_Fact *)p_Var9);
              inject_production(this);
              LOCK();
              (this->super_HLPOverlay).super_Overlay.invalidated.super___atomic_base<unsigned_long>.
              _M_i = 1;
              UNLOCK();
              pCVar10 = (CSTOverlay *)0x0;
              goto LAB_00161b1b;
            }
            Overlay::load_code((Overlay *)this);
            p_Var4 = (this->super_HLPOverlay).bindings.object;
            if (p_Var4 == (_Object *)0x0) {
LAB_00161b7b:
              (this->super_HLPOverlay).bindings.object = (_Object *)this_01;
              LOCK();
              paVar1 = &(this_01->super_BindingMap).super__Object.refCount;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + 1;
              UNLOCK();
            }
            else {
              LOCK();
              (p_Var4->refCount).super___atomic_base<long>._M_i =
                   (p_Var4->refCount).super___atomic_base<long>._M_i + 1;
              UNLOCK();
              pHVar5 = (HLPBindingMap *)(this->super_HLPOverlay).bindings.object;
              if (pHVar5 != this_01) {
                if (pHVar5 != (HLPBindingMap *)0x0) {
                  LOCK();
                  paVar1 = &(pHVar5->super_BindingMap).super__Object.refCount;
                  (paVar1->super___atomic_base<long>)._M_i =
                       (paVar1->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  if ((pHVar5->super_BindingMap).super__Object.refCount.super___atomic_base<long>.
                      _M_i < 1) {
                    (*(pHVar5->super_BindingMap).super__Object._vptr__Object[1])();
                  }
                }
                goto LAB_00161b7b;
              }
            }
            bVar7 = HLPOverlay::evaluate_fwd_guards(&this->super_HLPOverlay);
            if (bVar7) {
              update(this,this_01,(_Fact *)(input->super_View).object.object,(_Fact *)p_Var9);
              inject_production(this);
              LOCK();
              (this->super_HLPOverlay).super_Overlay.invalidated.super___atomic_base<unsigned_long>.
              _M_i = 1;
              UNLOCK();
              *offspring = (CSTOverlay *)0x0;
              HLPOverlay::store_evidence
                        (&this->super_HLPOverlay,(_Fact *)(input->super_View).object.object,
                         this_00 != (Pred *)0x0,simulation);
            }
            else {
              pAVar6 = (this->super_HLPOverlay).super_Overlay.code;
              if (pAVar6 != (Atom *)0x0) {
                if (*(long *)(pAVar6 + -8) != 0) {
                  lVar12 = *(long *)(pAVar6 + -8) << 2;
                  do {
                    r_code::Atom::~Atom(pAVar6 + lVar12 + -4);
                    lVar12 = lVar12 + -4;
                  } while (lVar12 != 0);
                }
                operator_delete__(pAVar6 + -8);
              }
              (this->super_HLPOverlay).super_Overlay.code = (Atom *)0x0;
              *offspring = (CSTOverlay *)0x0;
            }
            if (p_Var4 != (_Object *)0x0) {
              LOCK();
              (p_Var4->refCount).super___atomic_base<long>._M_i =
                   (p_Var4->refCount).super___atomic_base<long>._M_i + -1;
              UNLOCK();
              if ((p_Var4->refCount).super___atomic_base<long>._M_i < 1) {
                (*p_Var4->_vptr__Object[1])(p_Var4);
              }
            }
          }
          else {
            pCVar10 = get_offspring(this,this_01,(_Fact *)(input->super_View).object.object,
                                    (_Fact *)p_Var9);
LAB_00161b1b:
            *offspring = pCVar10;
            bVar7 = true;
            HLPOverlay::store_evidence
                      (&this->super_HLPOverlay,(_Fact *)(input->super_View).object.object,
                       this_00 != (Pred *)0x0,simulation);
          }
          goto LAB_00161abf;
        }
        break;
      }
    }
    *offspring = (CSTOverlay *)0x0;
    bVar7 = false;
LAB_00161abf:
    LOCK();
    paVar1 = &(this_01->super_BindingMap).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if ((this_01->super_BindingMap).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
      (*(this_01->super_BindingMap).super__Object._vptr__Object[1])(this_01);
    }
  }
  else {
LAB_0016195b:
    *offspring = (CSTOverlay *)0x0;
LAB_00161962:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool CSTOverlay::reduce(View *input, CSTOverlay *&offspring)
{
    if (input->object->is_invalidated()) {
        offspring = nullptr;
        return false;
    }

    for (P<_Fact> currentInput : inputs) { // discard inputs that already matched.
        if (((_Fact *)input->object) == currentInput) {
            offspring = nullptr;
            return false;
        }
    }

    // uint64_t now=Now();
    // if(match_deadline==0)
    // std::cout<<Time::ToString_seconds(Now()-st)<<" "<<std::hex<<this<<std::dec<<" (0) "<<input->object->get_oid()<<std::endl;
    // else
    // std::cout<<Time::ToString_seconds(Now()-st)<<" "<<std::hex<<this<<std::dec<<" ("<<Time::ToString_seconds(match_deadline-st)<<") "<<input->object->get_oid()<<std::endl;
    _Fact *input_object;
    Pred *prediction = ((_Fact *)input->object)->get_pred();
    bool simulation;

    if (prediction) {
        input_object = prediction->get_target(); // input_object is f1 as in f0->pred->f1->object.
        simulation = prediction->is_simulation();
    } else {
        input_object = (_Fact *)input->object;
        simulation = false;
    }

    P<HLPBindingMap> bm = new HLPBindingMap();
    _Fact *bound_pattern = nullptr;
    r_code::list<P<_Fact> >::const_iterator p;

    for (p = patterns.begin(); p != patterns.end(); ++p) {
        bm->load(bindings);

        if (inputs.size() == 0) {
            bm->reset_fwd_timings(input_object);
        }

        if (bm->match_fwd_strict(input_object, *p)) {
            bound_pattern = *p;
            break;
        }
    }

    if (bound_pattern) {
        //if(match_deadline==0){
        // std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" "<<std::hex<<this<<std::dec<<" (0) ";
        //}else{
        // std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" "<<std::hex<<this<<std::dec<<" ("<<Time::ToString_seconds(match_deadline-Utils::GetTimeReference())<<") ";
        //}
        if (patterns.size() == 1) { // last match.
            if (!code) {
                load_code();
                P<HLPBindingMap> original_bindings = bindings;
                bindings = bm;

                if (evaluate_fwd_guards()) { // may update bindings; full match.
                    //std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" full match\n";
                    update(bm, (_Fact *)input->object, bound_pattern);
                    inject_production();
                    invalidate();
                    offspring = nullptr;
                    store_evidence(input->object, prediction, simulation);
                    return true;
                } else {
                    //std::cout<<" guards failed\n";
                    delete[] code;
                    code = nullptr;
                    offspring = nullptr;
                    return false;
                }
            } else { // guards already evaluated, full match.
                //std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" full match\n";
                update(bm, (_Fact *)input->object, bound_pattern);
                inject_production();
                invalidate();
                offspring = nullptr;
                store_evidence(input->object, prediction, simulation);
                return true;
            }
        } else {
            //std::cout<<" match\n";
            offspring = get_offspring(bm, (_Fact *)input->object, bound_pattern);
            store_evidence(input->object, prediction, simulation);
            return true;
        }
    } else {
        //std::cout<<" no match\n";
        offspring = nullptr;
        return false;
    }
}